

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O0

uint __thiscall aiMesh::GetNumUVChannels(aiMesh *this)

{
  bool bVar1;
  uint local_14;
  uint n;
  aiMesh *this_local;
  
  local_14 = 0;
  while( true ) {
    bVar1 = false;
    if (local_14 < 8) {
      bVar1 = this->mTextureCoords[local_14] != (aiVector3D *)0x0;
    }
    if (!bVar1) break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

unsigned int GetNumUVChannels() const {
        unsigned int n( 0 );
        while (n < AI_MAX_NUMBER_OF_TEXTURECOORDS && mTextureCoords[n]) {
            ++n;
        }

        return n;
    }